

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::evalTexture1DProjGrad2(ShaderEvalContext *c,TexLookupParams *p)

{
  float fVar1;
  float fVar2;
  Texture1D *pTVar3;
  int i_1;
  int i;
  long lVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  Vector<float,_4> res;
  Vector<float,_4> res_1;
  float local_48 [4];
  undefined8 local_38;
  undefined8 uStack_30;
  float local_28 [4];
  
  fVar1 = c->in[0].m_data[0];
  fVar2 = c->in[0].m_data[1];
  fVar6 = (float)(c->textures[0].tex1D)->m_width;
  fVar7 = c->in[1].m_data[0] * fVar6;
  fVar6 = fVar6 * c->in[2].m_data[0];
  uVar5 = -(uint)(-fVar7 <= fVar7);
  fVar7 = (float)(~uVar5 & (uint)-fVar7 | (uint)fVar7 & uVar5);
  uVar5 = -(uint)(-fVar6 <= fVar6);
  fVar6 = (float)(~uVar5 & (uint)-fVar6 | (uint)fVar6 & uVar5);
  uVar5 = -(uint)(fVar6 <= fVar7);
  fVar6 = logf((float)(~uVar5 & (uint)fVar6 | uVar5 & (uint)fVar7));
  pTVar3 = c->textures[0].tex1D;
  lVar4 = 0;
  tcu::sampleLevelArray1D
            ((ConstPixelBufferAccess *)local_28,(int)(pTVar3->m_view).m_levels,
             (Sampler *)(ulong)(uint)(pTVar3->m_view).m_numLevels,fVar1 / fVar2,(int)c + 0x70,
             fVar6 * 1.442695);
  local_48[0] = 0.0;
  local_48[1] = 0.0;
  local_48[2] = 0.0;
  local_48[3] = 0.0;
  do {
    local_48[lVar4] = local_28[lVar4] * (p->scale).m_data[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  local_38 = 0;
  uStack_30 = 0;
  lVar4 = 0;
  do {
    *(float *)((long)&local_38 + lVar4 * 4) = local_48[lVar4] + (p->bias).m_data[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  *(undefined8 *)(c->color).m_data = local_38;
  *(undefined8 *)((c->color).m_data + 2) = uStack_30;
  return;
}

Assistant:

static void		evalTexture1DProjGrad2			(ShaderEvalContext& c, const TexLookupParams& p)	{ c.color = texture1D(c, c.in[0].x()/c.in[0].y(), computeLodFromGrad1D(c))*p.scale + p.bias; }